

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_test.cpp
# Opt level: O0

string * remove_brakets(string *in)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t i;
  string *r;
  undefined8 local_20;
  
  std::__cxx11::string::string(in_RDI);
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), local_20 < uVar1; local_20 = local_20 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    if ((*pcVar2 != '[') &&
       (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 != ']')) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::operator+=(in_RDI,*pcVar2);
    }
  }
  return in_RDI;
}

Assistant:

std::string remove_brakets(std::string const &in)
{
    std::string r;
    for(size_t i=0;i<in.size();i++)
        if(in[i]!='[' && in[i]!=']')
            r+= in[i];
    return r;
}